

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O0

void operations_test<viennamath::ct_variable<0ul>,viennamath::ct_constant<7l>>
               (ct_variable<0UL> *t,ct_constant<7L> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<7L> *rhs;
  ct_variable<0UL> *rhs_00;
  ct_constant<7L> *rhs_01;
  ct_variable<0UL> *rhs_02;
  ct_constant<7L> *rhs_03;
  ct_variable<0UL> *rhs_04;
  ct_constant<7L> *rhs_05;
  ct_variable<0UL> *rhs_06;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
  local_46 [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>
  local_42 [2];
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_3e [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<7L>_>
  local_3a [2];
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>
  local_36 [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_minus<double>,_viennamath::ct_constant<7L>_>
  local_32 [2];
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_2e [2];
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>
  local_2a;
  double local_28;
  double u2_local;
  double t2_local;
  ct_constant<7L> *u_local;
  ct_variable<0UL> *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = (ct_constant<7L> *)t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<0UL> *)u_local);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_constant<7L> *)t2_local);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+((type *)u_local,(ct_variable<0UL> *)t2_local,rhs);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<7l>>>
            (&local_2a,u2_local + local_28);
  viennamath::operator+((type *)t2_local,u_local,rhs_00);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
            (local_2e,local_28 + u2_local);
  viennamath::operator-((type *)u_local,(ct_variable<0UL> *)t2_local,rhs_01);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_minus<double>,viennamath::ct_constant<7l>>>
            (local_32,u2_local - local_28);
  viennamath::operator-((type *)t2_local,u_local,rhs_02);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<0ul>>>
            (local_36,local_28 - u2_local);
  viennamath::operator*((type *)u_local,(ct_variable<0UL> *)t2_local,rhs_03);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<7l>>>
            (local_3a,u2_local * local_28);
  viennamath::operator*((type *)t2_local,u_local,rhs_04);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (local_3e,local_28 * u2_local);
  viennamath::operator/((type *)u_local,(ct_variable<0UL> *)t2_local,rhs_05);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_div<double>,viennamath::ct_constant<7l>>>
            (local_42,u2_local / local_28);
  viennamath::operator/((type *)t2_local,u_local,rhs_06);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            (local_46,local_28 / u2_local);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}